

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_opt_goal(REF_DBL *metric,REF_GRID ref_grid,REF_INT nequations,REF_DBL *solution,
                   REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
                   REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  REF_DBL *grad;
  REF_DBL *scalar;
  REF_DBL *hessian;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  REF_DBL *pRVar9;
  long lVar10;
  long lVar11;
  REF_DBL *pRVar12;
  char *pcVar13;
  ulong uVar14;
  double dVar15;
  REF_DBL *local_a0;
  REF_DBL *local_88;
  
  pRVar1 = ref_grid->node;
  uVar5 = 0;
  pRVar3 = metric;
  uVar14 = (ulong)(uint)pRVar1->max;
  if (pRVar1->max < 1) {
    uVar14 = uVar5;
  }
  for (; uVar5 != uVar14; uVar5 = uVar5 + 1) {
    if (-1 < pRVar1->global[uVar5]) {
      for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
        pRVar3[lVar10] = 0.0;
      }
    }
    pRVar3 = pRVar3 + 6;
  }
  uVar14 = 0;
  if (0 < nequations) {
    uVar14 = (ulong)(uint)nequations;
  }
  local_88 = solution + nequations;
  uVar5 = 0;
  local_a0 = solution;
  do {
    if (uVar5 == uVar14) {
      if (ref_grid->twod != 0) {
        uVar5 = 0;
        uVar14 = (ulong)(uint)pRVar1->max;
        if (pRVar1->max < 1) {
          uVar14 = uVar5;
        }
        pRVar3 = metric + 4;
        for (; uVar14 != uVar5; uVar5 = uVar5 + 1) {
          if (-1 < pRVar1->global[uVar5]) {
            pRVar3[-2] = 0.0;
            *pRVar3 = 0.0;
            pRVar3[1] = 1.0;
          }
          pRVar3 = pRVar3 + 6;
        }
      }
      uVar2 = ref_recon_roundoff_limit(metric,ref_grid);
      if (uVar2 == 0) {
        uVar2 = ref_metric_local_scale(metric,ref_grid,p_norm);
        if (uVar2 == 0) {
          uVar2 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,target_complexity);
          if (uVar2 == 0) {
            return 0;
          }
          uVar14 = (ulong)uVar2;
          pcVar13 = "gradation at complexity";
          uVar8 = 0xa7a;
        }
        else {
          uVar14 = (ulong)uVar2;
          pcVar13 = "local scale lp norm";
          uVar8 = 0xa76;
        }
      }
      else {
        uVar14 = (ulong)uVar2;
        pcVar13 = "floor metric eigenvalues based on grid size and solution jitter";
        uVar8 = 0xa74;
      }
LAB_001c7a3c:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar8,"ref_metric_opt_goal",uVar14,pcVar13);
      return (REF_STATUS)uVar14;
    }
    uVar2 = pRVar1->max;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa51,"ref_metric_opt_goal","malloc lam of REF_DBL negative");
      return 1;
    }
    pRVar3 = (REF_DBL *)malloc(uVar4 * 8);
    if (pRVar3 == (REF_DBL *)0x0) {
      pcVar13 = "malloc lam of REF_DBL NULL";
      uVar8 = 0xa51;
LAB_001c7b90:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar8,"ref_metric_opt_goal",pcVar13);
      return 2;
    }
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      pRVar3[uVar6] = 0.0;
    }
    grad = (REF_DBL *)malloc(uVar4 * 0x18);
    if (grad == (REF_DBL *)0x0) {
      pcVar13 = "malloc grad_lam of REF_DBL NULL";
      uVar8 = 0xa52;
      goto LAB_001c7b90;
    }
    for (uVar6 = 0; (uVar4 * 3 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      grad[uVar6] = 0.0;
    }
    scalar = (REF_DBL *)malloc(uVar4 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar13 = "malloc flux of REF_DBL NULL";
      uVar8 = 0xa53;
      goto LAB_001c7b90;
    }
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      scalar[uVar6] = 0.0;
    }
    hessian = (REF_DBL *)malloc((ulong)(uVar2 * 6) * 8);
    if (hessian == (REF_DBL *)0x0) {
      pcVar13 = "malloc hess_flux of REF_DBL NULL";
      uVar8 = 0xa54;
      goto LAB_001c7b90;
    }
    for (uVar6 = 0; uVar2 * 6 != uVar6; uVar6 = uVar6 + 1) {
      hessian[uVar6] = 0.0;
    }
    pRVar9 = local_a0;
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      if (-1 < pRVar1->global[uVar6]) {
        pRVar3[uVar6] = *pRVar9;
      }
      pRVar9 = pRVar9 + nequations * 4;
    }
    uVar2 = ref_recon_gradient(ref_grid,pRVar3,grad,reconstruction);
    if (uVar2 != 0) {
      uVar14 = (ulong)uVar2;
      pcVar13 = "grad_lam";
      uVar8 = 0xa59;
      goto LAB_001c7a3c;
    }
    pRVar9 = local_88;
    lVar10 = 0;
    while (lVar10 != 3) {
      uVar4 = (ulong)(uint)pRVar1->max;
      if (pRVar1->max < 1) {
        uVar4 = 0;
      }
      pRVar7 = pRVar9;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        if (-1 < pRVar1->global[uVar6]) {
          scalar[uVar6] = *pRVar7;
        }
        pRVar7 = pRVar7 + nequations * 4;
      }
      uVar2 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
      if (uVar2 != 0) {
        uVar14 = (ulong)uVar2;
        pcVar13 = "hess";
        uVar8 = 0xa5f;
        goto LAB_001c7a3c;
      }
      uVar4 = (ulong)(uint)pRVar1->max;
      if (pRVar1->max < 1) {
        uVar4 = 0;
      }
      pRVar7 = metric;
      pRVar12 = hessian;
      for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        if (-1 < pRVar1->global[uVar6]) {
          dVar15 = grad[lVar10 + uVar6 * 3];
          if (dVar15 <= -dVar15) {
            dVar15 = -dVar15;
          }
          for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
            pRVar7[lVar11] = pRVar12[lVar11] * dVar15 + pRVar7[lVar11];
          }
        }
        pRVar7 = pRVar7 + 6;
        pRVar12 = pRVar12 + 6;
      }
      pRVar9 = pRVar9 + nequations;
      lVar10 = lVar10 + 1;
    }
    free(hessian);
    free(scalar);
    free(grad);
    free(pRVar3);
    uVar5 = uVar5 + 1;
    local_a0 = local_a0 + 1;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_opt_goal(REF_DBL *metric, REF_GRID ref_grid,
                                       REF_INT nequations, REF_DBL *solution,
                                       REF_RECON_RECONSTRUCTION reconstruction,
                                       REF_INT p_norm, REF_DBL gradation,
                                       REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT ldim;
  REF_INT var, dir;

  ldim = 4 * nequations;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) metric[i + 6 * node] = 0.0;
  }

  for (var = 0; var < nequations; var++) {
    REF_DBL *lam, *grad_lam, *flux, *hess_flux;
    ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = solution[var + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");

    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        flux[node] = solution[var + nequations * (1 + dir) + ldim * node];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++)
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
      }
    }
    ref_free(hess_flux);
    ref_free(flux);
    ref_free(grad_lam);
    ref_free(lam);
  }
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");

  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}